

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-cdf.c
# Opt level: O1

int read_VDR(coda_cdf_product *product_file,int64_t offset,int is_zvar)

{
  ushort *puVar1;
  undefined1 uVar2;
  coda_array_ordering array_ordering;
  ushort uVar3;
  long offset_00;
  undefined2 uVar4;
  char cVar5;
  undefined1 uVar6;
  undefined1 uVar7;
  undefined1 uVar8;
  undefined1 uVar9;
  undefined1 uVar10;
  undefined1 uVar11;
  undefined1 uVar12;
  char cVar13;
  undefined1 uVar14;
  undefined1 uVar15;
  undefined1 uVar16;
  undefined1 uVar17;
  undefined1 uVar18;
  undefined1 uVar19;
  undefined1 uVar20;
  char cVar21;
  undefined1 uVar22;
  undefined1 uVar23;
  undefined1 uVar24;
  undefined1 uVar25;
  undefined1 uVar26;
  undefined1 uVar27;
  undefined1 uVar28;
  undefined1 uVar29;
  undefined1 uVar30;
  char cVar31;
  undefined1 uVar32;
  undefined1 uVar33;
  undefined1 uVar34;
  ushort uVar35;
  int iVar36;
  ulong uVar37;
  coda_dynamic_type *field_type;
  int32_t first;
  uchar *v;
  char *pcVar38;
  int32_t iVar39;
  uint has_compression;
  long lVar41;
  int32_t srecords;
  int32_t num;
  int32_t num_elems;
  int32_t flags;
  int32_t max_rec;
  int32_t data_type;
  int64_t cpr_spr_offset;
  int64_t vxr_tail;
  int64_t vxr_head;
  int32_t blocking_factor;
  int32_t num_dims;
  int64_t vdr_next;
  int32_t record_type;
  undefined8 local_1c0;
  ulong local_1b8;
  int32_t *local_1b0;
  int32_t local_1a4;
  long local_1a0;
  long local_198;
  ulong local_190;
  coda_cdf_variable *variable;
  long local_180;
  int32_t dim_varys [8];
  int32_t zdim_sizes [8];
  char name [257];
  int32_t *piVar40;
  
  if (offset == 0) {
    return 0;
  }
  iVar36 = read_bytes(product_file->raw_product,offset + 8,4,&record_type);
  if (iVar36 < 0) {
    return -1;
  }
  uVar2 = (undefined1)record_type;
  uVar35 = record_type._1_2_ << 8;
  uVar3 = record_type._1_2_ >> 8;
  record_type = CONCAT13(uVar2,CONCAT21(uVar35 | uVar3,record_type._3_1_));
  if (is_zvar == 0) {
    if (record_type != 3) {
      pcVar38 = "CDF file has invalid record type (%d) for rVDR record";
      goto LAB_00148149;
    }
  }
  else if (record_type != 8) {
    pcVar38 = "CDF file has invalid record type (%d) for zVDR record";
LAB_00148149:
    coda_set_error(-300,pcVar38);
    return -1;
  }
  iVar36 = read_bytes(product_file->raw_product,offset + 0xc,8,&vdr_next);
  if (iVar36 < 0) {
    return -1;
  }
  iVar36 = read_bytes(product_file->raw_product,offset + 0x14,4,&data_type);
  if (iVar36 < 0) {
    return -1;
  }
  iVar36 = read_bytes(product_file->raw_product,offset + 0x18,4,&max_rec);
  if (iVar36 < 0) {
    return -1;
  }
  iVar36 = read_bytes(product_file->raw_product,offset + 0x1c,8,&vxr_head);
  if (iVar36 < 0) {
    return -1;
  }
  iVar36 = read_bytes(product_file->raw_product,offset + 0x24,8,&vxr_tail);
  if (iVar36 < 0) {
    return -1;
  }
  iVar36 = read_bytes(product_file->raw_product,offset + 0x2c,4,&flags);
  if (iVar36 < 0) {
    return -1;
  }
  iVar36 = read_bytes(product_file->raw_product,offset + 0x30,4,&srecords);
  if (iVar36 < 0) {
    return -1;
  }
  iVar36 = read_bytes(product_file->raw_product,offset + 0x40,4,&num_elems);
  if (iVar36 < 0) {
    return -1;
  }
  iVar36 = read_bytes(product_file->raw_product,offset + 0x44,4,&num);
  if (iVar36 < 0) {
    return -1;
  }
  iVar36 = read_bytes(product_file->raw_product,offset + 0x48,8,&cpr_spr_offset);
  if (iVar36 < 0) {
    return -1;
  }
  iVar36 = read_bytes(product_file->raw_product,offset + 0x50,4,&blocking_factor);
  if (iVar36 < 0) {
    return -1;
  }
  iVar36 = read_bytes(product_file->raw_product,offset + 0x54,0x100,name);
  if (iVar36 < 0) {
    return -1;
  }
  name[0x100] = '\0';
  rtrim(name);
  uVar34 = vdr_next._7_1_;
  uVar33 = vdr_next._4_1_;
  uVar32 = vdr_next._3_1_;
  cVar31 = (char)vdr_next;
  uVar30 = blocking_factor._3_1_;
  uVar29 = blocking_factor._2_1_;
  uVar28 = vxr_head._7_1_;
  uVar27 = vxr_head._6_1_;
  uVar26 = vxr_head._5_1_;
  uVar25 = vxr_head._4_1_;
  uVar24 = vxr_head._3_1_;
  uVar23 = vxr_head._2_1_;
  uVar22 = vxr_head._1_1_;
  cVar21 = (char)vxr_head;
  uVar20 = vxr_tail._7_1_;
  uVar19 = vxr_tail._6_1_;
  uVar18 = vxr_tail._5_1_;
  uVar17 = vxr_tail._4_1_;
  uVar16 = vxr_tail._3_1_;
  uVar15 = vxr_tail._2_1_;
  uVar14 = vxr_tail._1_1_;
  cVar13 = (char)vxr_tail;
  uVar12 = cpr_spr_offset._7_1_;
  uVar11 = cpr_spr_offset._6_1_;
  uVar10 = cpr_spr_offset._5_1_;
  uVar9 = cpr_spr_offset._4_1_;
  uVar8 = cpr_spr_offset._3_1_;
  uVar7 = cpr_spr_offset._2_1_;
  uVar6 = cpr_spr_offset._1_1_;
  uVar2 = (undefined1)cpr_spr_offset;
  vdr_next._7_1_ = (char)vdr_next;
  vdr_next._0_1_ = uVar34;
  uVar35 = vdr_next._1_2_ << 8 | vdr_next._1_2_ >> 8;
  vdr_next._1_2_ = vdr_next._5_2_ << 8 | vdr_next._5_2_ >> 8;
  vdr_next._4_1_ = vdr_next._3_1_;
  vdr_next._3_1_ = uVar33;
  uVar4 = CONCAT11((undefined1)data_type,data_type._1_1_);
  data_type = CONCAT22(uVar4,CONCAT11(data_type._2_1_,data_type._3_1_));
  uVar4 = CONCAT11((undefined1)max_rec,max_rec._1_1_);
  max_rec = CONCAT22(uVar4,CONCAT11(max_rec._2_1_,max_rec._3_1_));
  vxr_head._7_1_ = (char)vxr_head;
  vxr_head._0_1_ = uVar28;
  vxr_head._6_1_ = vxr_head._1_1_;
  vxr_head._1_1_ = uVar27;
  vxr_head._5_1_ = vxr_head._2_1_;
  vxr_head._2_1_ = uVar26;
  vxr_head._4_1_ = vxr_head._3_1_;
  vxr_head._3_1_ = uVar25;
  vxr_tail._7_1_ = (char)vxr_tail;
  vxr_tail._0_1_ = uVar20;
  vxr_tail._6_1_ = vxr_tail._1_1_;
  vxr_tail._1_1_ = uVar19;
  vxr_tail._5_1_ = vxr_tail._2_1_;
  vxr_tail._2_1_ = uVar18;
  vxr_tail._4_1_ = vxr_tail._3_1_;
  vxr_tail._3_1_ = uVar17;
  uVar4 = CONCAT11((undefined1)flags,flags._1_1_);
  flags = CONCAT22(uVar4,CONCAT11(flags._2_1_,flags._3_1_));
  uVar4 = CONCAT11((undefined1)srecords,srecords._1_1_);
  srecords = CONCAT22(uVar4,CONCAT11(srecords._2_1_,srecords._3_1_));
  cVar5 = (char)num_elems;
  uVar4 = CONCAT11((char)num_elems,num_elems._1_1_);
  num_elems = CONCAT22(uVar4,CONCAT11(num_elems._2_1_,num_elems._3_1_));
  uVar4 = CONCAT11((undefined1)num,num._1_1_);
  num = CONCAT22(uVar4,CONCAT11(num._2_1_,num._3_1_));
  cpr_spr_offset._7_1_ = (undefined1)cpr_spr_offset;
  cpr_spr_offset._0_1_ = uVar12;
  cpr_spr_offset._6_1_ = cpr_spr_offset._1_1_;
  cpr_spr_offset._1_1_ = uVar11;
  cpr_spr_offset._5_1_ = cpr_spr_offset._2_1_;
  cpr_spr_offset._2_1_ = uVar10;
  cpr_spr_offset._4_1_ = cpr_spr_offset._3_1_;
  cpr_spr_offset._3_1_ = uVar9;
  blocking_factor._3_1_ = (undefined1)blocking_factor;
  blocking_factor._0_1_ = uVar30;
  blocking_factor._2_1_ = blocking_factor._1_1_;
  blocking_factor._1_1_ = uVar29;
  offset_00 = CONCAT17(cVar31,CONCAT25(uVar35,CONCAT14(uVar32,CONCAT13(uVar33,CONCAT21(vdr_next.
                                                  _1_2_,uVar34)))));
  vdr_next._5_2_ = uVar35;
  if ((cVar31 < '\0') || (lVar41 = product_file->file_size, lVar41 <= offset_00)) {
    pcVar38 = "CDF file has invalid offset for VDR record";
  }
  else {
    local_180 = CONCAT17(cVar21,CONCAT16(uVar22,CONCAT15(uVar23,CONCAT14(uVar24,CONCAT13(uVar25,
                                                  CONCAT12(uVar26,CONCAT11(uVar27,uVar28)))))));
    if ((cVar21 < '\0' || lVar41 <= local_180) ||
       (cVar13 < '\0' ||
        lVar41 <= CONCAT17(cVar13,CONCAT16(uVar14,CONCAT15(uVar15,CONCAT14(uVar16,CONCAT13(uVar17,
                                                  CONCAT12(uVar18,CONCAT11(uVar19,uVar20))))))))) {
      pcVar38 = "CDF file has invalid offset for VXR record";
    }
    else {
      local_190 = (ulong)(uint)num_elems;
      if (cVar5 < '\0') {
        pcVar38 = "CDF file has invalid number of elements in VDR record";
      }
      else {
        local_198 = (long)num;
        if (local_198 < 0) {
          pcVar38 = "CDF file has invalid variable number in VDR record";
        }
        else {
          local_1a0 = CONCAT17(uVar2,CONCAT16(uVar6,CONCAT15(uVar7,CONCAT14(uVar8,CONCAT13(uVar9,
                                                  CONCAT12(uVar10,CONCAT11(uVar11,uVar12)))))));
          if (-2 < local_1a0 && local_1a0 < lVar41) {
            local_1a4 = data_type;
            if (data_type != 0x20) {
              if (is_zvar == 0) {
                num_dims = product_file->rnum_dims;
              }
              else {
                iVar36 = read_bytes(product_file->raw_product,offset + 0x154,4,&num_dims);
                if (iVar36 < 0) {
                  return -1;
                }
                cVar5 = (char)num_dims;
                uVar35 = num_dims._1_2_ << 8;
                uVar3 = num_dims._1_2_ >> 8;
                num_dims = CONCAT13(cVar5,CONCAT21(uVar35 | uVar3,num_dims._3_1_));
                uVar37 = (ulong)(uint)num_dims;
                local_1b8 = uVar37;
                if (cVar5 < '\0') {
                  pcVar38 = "CDF variable \'%s\' has invalid number of dimensions (%d)";
                  goto LAB_0014832a;
                }
                if (8 < num_dims) {
                  pcVar38 = "CDF variable \'%s\' has too many dimensions (%d)";
                  goto LAB_0014832a;
                }
                offset = offset + 0x158;
                if (uVar37 != 0) {
                  local_1c0 = zdim_sizes;
                  lVar41 = offset;
                  local_1b0 = (int32_t *)uVar37;
                  do {
                    iVar36 = read_bytes(product_file->raw_product,lVar41,4,local_1c0);
                    if (iVar36 < 0) {
                      return -1;
                    }
                    uVar2 = *(undefined1 *)((long)local_1c0 + 3);
                    *(char *)((long)local_1c0 + 3) = (char)*local_1c0;
                    *(undefined1 *)local_1c0 = uVar2;
                    puVar1 = (ushort *)((long)local_1c0 + 1);
                    *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
                    lVar41 = lVar41 + 4;
                    local_1c0 = local_1c0 + 1;
                    local_1b0 = (int32_t *)((long)local_1b0 - 1);
                  } while (local_1b0 != (int32_t *)0x0);
                  offset = offset + (ulong)(uint)((int)local_1b8 << 2);
                }
              }
              local_1b0 = (int32_t *)(long)num_dims;
              if (0 < (long)local_1b0) {
                piVar40 = dim_varys;
                local_1c0 = local_1b0;
                do {
                  iVar36 = read_bytes(product_file->raw_product,offset,4,piVar40);
                  if (iVar36 < 0) {
                    return -1;
                  }
                  uVar2 = *(undefined1 *)((long)piVar40 + 3);
                  *(char *)((long)piVar40 + 3) = (char)*piVar40;
                  *(undefined1 *)piVar40 = uVar2;
                  puVar1 = (ushort *)((long)piVar40 + 1);
                  *puVar1 = *puVar1 << 8 | *puVar1 >> 8;
                  offset = offset + 4;
                  piVar40 = piVar40 + 1;
                  local_1c0 = (int32_t *)((long)local_1c0 + -1);
                } while (local_1c0 != (int32_t *)0x0);
              }
              iVar39 = max_rec;
              local_1c0 = (int32_t *)(CONCAT44(local_1c0._4_4_,flags) & 0xffffffff00000001);
              if (max_rec == 0 || (flags & 1U) != 0) {
                has_compression = flags & 4;
                if ((local_1a0 != -1 && has_compression != 0) &&
                   (iVar36 = read_CPR(product_file,local_1a0), iVar36 != 0)) {
                  return -1;
                }
                if (product_file->root_type->num_fields != local_198) {
                  coda_set_error(-300,"CDF variable has invalid number \'%d\', expected \'%ld\'",
                                 local_198);
                  return -1;
                }
                if (is_zvar == 0) {
                  piVar40 = product_file->rdim_sizes;
                  array_ordering = product_file->array_ordering;
                }
                else {
                  array_ordering = product_file->array_ordering;
                  piVar40 = zdim_sizes;
                }
                field_type = coda_cdf_variable_new
                                       (local_1a4,iVar39,(int32_t)local_1c0,(int32_t)local_1b0,
                                        piVar40,dim_varys,array_ordering,(int32_t)local_190,srecords
                                        ,has_compression,&variable);
                iVar39 = (int32_t)piVar40;
                if (field_type == (coda_dynamic_type *)0x0) {
                  return -1;
                }
                first = 1;
                iVar36 = coda_mem_record_add_field(product_file->root_type,name,field_type,1);
                if (iVar36 != 0) {
                  coda_cdf_type_delete(field_type);
                  return -1;
                }
                iVar36 = read_VXR(product_file,variable,local_180,first,iVar39);
                if (iVar36 != 0) {
                  return -1;
                }
                iVar36 = read_VDR(product_file,offset_00,is_zvar);
                return -(uint)(iVar36 != 0);
              }
              pcVar38 = 
              "CDF variable \'%s\' has non-varying record dimension but number of records (%d) is not equal to 1"
              ;
              uVar37 = (ulong)(max_rec + 1);
LAB_0014832a:
              coda_set_error(-300,pcVar38,name,uVar37);
              return -1;
            }
            pcVar38 = "CDF EPOCH16 data type is not supported";
            iVar36 = -200;
            goto LAB_0014817e;
          }
          pcVar38 = "CDF file has invalid offset for CPR/SPR record";
        }
      }
    }
  }
  iVar36 = -300;
LAB_0014817e:
  coda_set_error(iVar36,pcVar38);
  return -1;
}

Assistant:

static int read_VDR(coda_cdf_product *product_file, int64_t offset, int is_zvar)
{
    coda_dynamic_type *variable_type;
    coda_cdf_variable *variable;
    int32_t record_type;
    int64_t vdr_next;
    int32_t data_type;
    int32_t max_rec;
    int64_t vxr_head;
    int64_t vxr_tail;
    int32_t flags;
    int32_t srecords;
    int32_t num_elems;
    int32_t num;
    int64_t cpr_spr_offset;
    int32_t blocking_factor;
    char name[257];
    int32_t num_dims;
    int32_t zdim_sizes[CODA_MAX_NUM_DIMS];
    int32_t dim_varys[CODA_MAX_NUM_DIMS];
    int record_varys;
    int has_compression;
    int i;

    if (offset == 0)
    {
        return 0;
    }

    if (read_bytes(product_file->raw_product, offset + 8, 4, &record_type) < 0)
    {
        return -1;
    }
#ifndef WORDS_BIGENDIAN
    swap_int32(&record_type);
#endif
    if (is_zvar)
    {
        if (record_type != 8)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid record type (%d) for zVDR record", record_type);
            return -1;
        }
    }
    else
    {
        if (record_type != 3)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid record type (%d) for rVDR record", record_type);
            return -1;
        }
    }

    if (read_bytes(product_file->raw_product, offset + 12, 8, &vdr_next) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 20, 4, &data_type) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 24, 4, &max_rec) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 28, 8, &vxr_head) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 36, 8, &vxr_tail) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 44, 4, &flags) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 48, 4, &srecords) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 64, 4, &num_elems) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 68, 4, &num) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 72, 8, &cpr_spr_offset) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 80, 4, &blocking_factor) < 0)
    {
        return -1;
    }
    if (read_bytes(product_file->raw_product, offset + 84, 256, name) < 0)
    {
        return -1;
    }
    name[256] = '\0';
    rtrim(name);
#ifndef WORDS_BIGENDIAN
    swap_int64(&vdr_next);
    swap_int32(&data_type);
    swap_int32(&max_rec);
    swap_int64(&vxr_head);
    swap_int64(&vxr_tail);
    swap_int32(&flags);
    swap_int32(&srecords);
    swap_int32(&num_elems);
    swap_int32(&num);
    swap_int64(&cpr_spr_offset);
    swap_int32(&blocking_factor);
#endif
    if (vdr_next < 0 || vdr_next >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for VDR record");
        return -1;
    }
    if (vxr_head < 0 || vxr_head >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for VXR record");
        return -1;
    }
    if (vxr_tail < 0 || vxr_tail >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for VXR record");
        return -1;
    }
    if (num_elems < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid number of elements in VDR record");
        return -1;
    }
    if (num < 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid variable number in VDR record");
        return -1;
    }
    if (cpr_spr_offset < -1 || cpr_spr_offset >= product_file->file_size)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF file has invalid offset for CPR/SPR record");
        return -1;
    }

    if (data_type == 32)
    {
        coda_set_error(CODA_ERROR_UNSUPPORTED_PRODUCT, "CDF EPOCH16 data type is not supported");
        return -1;
    }
    if (is_zvar)
    {
        if (read_bytes(product_file->raw_product, offset + 340, 4, &num_dims) < 0)
        {
            return -1;
        }
#ifndef WORDS_BIGENDIAN
        swap_int32(&num_dims);
#endif
        if (num_dims < 0)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF variable '%s' has invalid number of dimensions (%d)", name,
                           num_dims);
            return -1;
        }
        if (num_dims > CODA_MAX_NUM_DIMS)
        {
            coda_set_error(CODA_ERROR_PRODUCT, "CDF variable '%s' has too many dimensions (%d)", name, num_dims);
            return -1;
        }
        offset += 344;
        if (num_dims > 0)
        {
            for (i = 0; i < num_dims; i++)
            {
                if (read_bytes(product_file->raw_product, offset + i * 4, 4, &zdim_sizes[i]) < 0)
                {
                    return -1;
                }
#ifndef WORDS_BIGENDIAN
                swap_int32(&zdim_sizes[i]);
#endif
            }
            offset += num_dims * 4;
        }
    }
    else
    {
        num_dims = product_file->rnum_dims;
    }

    if (num_dims > 0)
    {
        for (i = 0; i < num_dims; i++)
        {
            if (read_bytes(product_file->raw_product, offset + i * 4, 4, &dim_varys[i]) < 0)
            {
                return -1;
            }
#ifndef WORDS_BIGENDIAN
            swap_int32(&dim_varys[i]);
#endif
        }
        offset += num_dims * 4;
    }
    record_varys = flags & 1;
    /* int has_pad_value = flags & 2; */
    has_compression = flags & 4;
    /* int64_t pad_value_offset = offset; */
    if (!record_varys && max_rec != 0)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF variable '%s' has non-varying record dimension but number of records "
                       "(%d) is not equal to 1", name, max_rec + 1);
        return -1;
    }

    if (has_compression && cpr_spr_offset != -1)
    {
        if (read_CPR(product_file, cpr_spr_offset) != 0)
        {
            return -1;
        }
    }
    if (product_file->root_type->num_fields != num)
    {
        coda_set_error(CODA_ERROR_PRODUCT, "CDF variable has invalid number '%d', expected '%ld'", num,
                       product_file->root_type->num_fields);
        return -1;
    }

    if (is_zvar)
    {
        variable_type = coda_cdf_variable_new(data_type, max_rec, record_varys, num_dims, zdim_sizes, dim_varys,
                                              product_file->array_ordering, num_elems, srecords, has_compression,
                                              &variable);
    }
    else
    {
        variable_type = coda_cdf_variable_new(data_type, max_rec, record_varys, num_dims, product_file->rdim_sizes,
                                              dim_varys, product_file->array_ordering, num_elems, srecords,
                                              has_compression, &variable);
    }
    if (variable_type == NULL)
    {
        return -1;
    }
    if (coda_mem_record_add_field(product_file->root_type, name, variable_type, 1) != 0)
    {
        coda_cdf_type_delete((coda_dynamic_type *)variable_type);
        return -1;
    }

    if (read_VXR(product_file, variable, vxr_head, 0, -1) != 0)
    {
        return -1;
    }

    if (read_VDR(product_file, vdr_next, is_zvar) != 0)
    {
        return -1;
    }

    return 0;
}